

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O2

int __thiscall Sudoku::doplnK(Sudoku *this,int x,int y,int cislo)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint *puVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  
  uVar6 = 0;
  if ((uint)y < 9 && (uint)x < 9) {
    uVar5 = y * 9 + x;
    bVar1 = *(byte *)((this->s).pole + uVar5);
    uVar6 = 0;
    if ((bVar1 & 0x10) == 0) {
      bVar2 = (byte)(((ushort)x & 0xff) / 3);
      bVar3 = (byte)(((ushort)y & 0xff) / 3);
      uVar6 = 1 << ((byte)cislo & 0x1f);
      bVar7 = (((this->s).sloupce[(uint)x] | (this->s).radky[(uint)y] |
               (this->s).ctverce[bVar2][bVar3]) >> (cislo & 0x1fU) & 1) == 0;
      if (bVar7) {
        *(byte *)((this->s).pole + uVar5) = bVar1 & 0xe0 | (byte)cislo & 0xf;
        puVar4 = (this->s).radky + (uint)y;
        *puVar4 = *puVar4 | uVar6;
        puVar4 = (this->s).sloupce + (uint)x;
        *puVar4 = *puVar4 | uVar6;
        puVar4 = (this->s).ctverce[bVar2] + bVar3;
        *puVar4 = *puVar4 | uVar6;
        puVar4 = &(this->s).doplnenych;
        *puVar4 = *puVar4 + 1;
      }
      uVar6 = (uint)bVar7;
    }
  }
  return uVar6;
}

Assistant:

int Sudoku::doplnK (int x, int y, int cislo)
{
  if(0 <= x && x < 9)
  {
    if(0 <= y && y < 9)
    {
      if(s.pole[y*9+x].pevne)// pevna cisla nelze prepisovat
        return false;
      unsigned int zakazano = s.radky[y] | s.sloupce[x] | s.ctverce[x/3][y/3];
      if((1 << cislo) & ~zakazano) // pokud nelze doplnit, koncime
      {
        s.pole[y*9+x].zapsane = cislo;
        // zakazeme pouzit cislo v radku, sloupci a ctverci
        s.radky[y] |= (1 << cislo);
        s.sloupce[x] |= (1 << cislo);
        s.ctverce[x/3][y/3] |= (1 << cislo);
        s.doplnenych++;
        return true;
      }
    }
  }
  return false;
}